

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void mp::internal::ReadBinary<mp::internal::EndiannessConverter,ExprPrinter>
               (TextReader<fmt::Locale> *reader,NLHeader *header,ExprPrinter *handler,int flags)

{
  BinaryReader<mp::internal::EndiannessConverter> bin_reader;
  undefined1 local_80 [64];
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter> local_40;
  
  ReaderBase::ReaderBase((ReaderBase *)local_80,&reader->super_ReaderBase);
  local_40.num_vars_and_exprs_ = 0;
  local_40.reader_ = (BinaryReader<mp::internal::EndiannessConverter> *)local_80;
  local_40.header_ = header;
  local_40.handler_ = handler;
  local_40.flags_ = flags;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::Read
            (&local_40);
  std::__cxx11::string::~string((string *)(local_80 + 0x20));
  return;
}

Assistant:

void ReadBinary(TextReader<> &reader, const NLHeader &header,
                Handler &handler, int flags) {
  BinaryReader<InputConverter> bin_reader(reader);
  NLReader<BinaryReader<InputConverter>, Handler>(
        bin_reader, header, handler, flags).Read();
}